

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_v2_public.c
# Opt level: O0

int main(void)

{
  ulong uVar1;
  long lVar2;
  uint8_t *message_dec;
  uint8_t *footer;
  size_t footer_len;
  size_t message_len_dec;
  char *enc;
  size_t foot_len;
  undefined8 uStack_78;
  uint8_t foot [7];
  size_t message_len;
  undefined1 local_68 [3];
  uint8_t message [5];
  uint8_t pk [32];
  uint8_t sk [64];
  
  uVar1 = paseto_init();
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Failed to initialize libpaseto\n");
    exit(-1);
  }
  uVar1 = paseto_v2_public_load_secret_key_base64
                    (pk + 0x18,
                     "mk0Nc8DCn9ZYR1IMqtq9g27CmGP5sNojeasZ1qop7R263gnGUfEo6RAp0OGvYctUoYMzVHoYAcT6Z4_56Tkj1g"
                    );
  if ((uVar1 & 1) == 0) {
    perror("Failed to load secret key");
    exit(-1);
  }
  uVar1 = paseto_v2_public_load_public_key_base64
                    (local_68,"ut4JxlHxKOkQKdDhr2HLVKGDM1R6GAHE-meP-ek5I9Y");
  if ((uVar1 & 1) == 0) {
    perror("Failed to load public key");
    exit(-1);
  }
  message_len._3_4_ = 0x74736574;
  message_len._7_1_ = 0;
  uStack_78 = 4;
  foot_len._1_4_ = 0x746f6f66;
  foot_len._5_2_ = 0x7265;
  foot_len._7_1_ = 0;
  enc = (char *)0x6;
  message_len_dec = paseto_v2_public_sign((long)&message_len + 3,4,pk + 0x18,(long)&foot_len + 1,6);
  if (message_len_dec == 0) {
    perror("paseto_v2_public_sign failed");
    exit(-1);
  }
  printf("signed: %s\n",message_len_dec);
  footer_len = 0;
  footer = (uint8_t *)0x0;
  lVar2 = paseto_v2_public_verify(message_len_dec,&footer_len,local_68,&message_dec,&footer);
  if (lVar2 == 0) {
    perror("paseto_v2_public_verify failed");
    exit(-1);
  }
  paseto_free(message_len_dec);
  printf("verified: %s\nfooter: %s\n",lVar2,message_dec);
  paseto_free(lVar2);
  return 0;
}

Assistant:

int main() {
    if (!paseto_init()) {
        fprintf(stderr, "Failed to initialize libpaseto\n");
        exit(-1);
    }

    uint8_t sk[paseto_v2_PUBLIC_SECRETKEYBYTES];
    if (!paseto_v2_public_load_secret_key_base64(sk,
            "mk0Nc8DCn9ZYR1IMqtq9g27CmGP5sNojeasZ1qop7R263gnGUfEo6RAp0OGvYctUoYMzVHoYAcT6Z4_56Tkj1g")) {
        perror("Failed to load secret key");
        exit(-1);
    }
    uint8_t pk[paseto_v2_PUBLIC_PUBLICKEYBYTES];
    if (!paseto_v2_public_load_public_key_base64(pk,
            "ut4JxlHxKOkQKdDhr2HLVKGDM1R6GAHE-meP-ek5I9Y")) {
        perror("Failed to load public key");
        exit(-1);
    }
    const uint8_t message[] = "test";
    size_t message_len = sizeof(message) - 1;
    const uint8_t foot[] = "footer";
    size_t foot_len = sizeof(foot) - 1;
    char *enc = paseto_v2_public_sign(
            message, message_len, sk, foot, foot_len);
    if (!enc) {
        perror("paseto_v2_public_sign failed");
        exit(-1);
    }
    printf("signed: %s\n", enc);

    size_t message_len_dec = 0;
    size_t footer_len = 0;
    uint8_t *footer;
    uint8_t *message_dec = paseto_v2_public_verify(
            enc, &message_len_dec, pk, &footer, &footer_len);
    if (!message_dec) {
        perror("paseto_v2_public_verify failed");
        exit(-1);
    }
    paseto_free(enc);
    printf("verified: %s\nfooter: %s\n", message_dec, footer);
    paseto_free(message_dec);
}